

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O2

char * __thiscall QMetaProperty::typeName(QMetaProperty *this)

{
  QMetaObject *mo;
  QMetaType QVar1;
  char *pcVar2;
  QByteArrayView QVar3;
  
  mo = this->mobj;
  if (mo == (QMetaObject *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    QVar1 = metaType(this);
    if (QVar1.d_ptr == (QMetaTypeInterface *)0x0) {
      QVar3 = typeNameFromTypeInfo(mo,(this->data).d[1]);
      pcVar2 = QVar3.m_data;
    }
    else {
      pcVar2 = (QVar1.d_ptr)->name;
    }
  }
  return pcVar2;
}

Assistant:

const char *QMetaProperty::typeName() const
{
    if (!mobj)
        return nullptr;
    // TODO: can the metatype be invalid for dynamic metaobjects?
    if (const auto mt = metaType(); mt.isValid())
        return mt.name();
    return typeNameFromTypeInfo(mobj, data.type()).constData();
}